

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O2

void icu_63::addCaseMapping(UnicodeSet *set,int32_t result,UChar *full,UnicodeString *str)

{
  ConstChar16Ptr local_28;
  UChar *local_20;
  
  if (-1 < result) {
    if (0x1f < (uint)result) {
      UnicodeSet::add(set,result);
      return;
    }
    local_28.p_ = full;
    UnicodeString::setTo(str,'\0',&local_28,result);
    local_20 = local_28.p_;
    UnicodeSet::add(set,str);
  }
  return;
}

Assistant:

static inline void
addCaseMapping(UnicodeSet &set, int32_t result, const UChar *full, UnicodeString &str) {
    if(result >= 0) {
        if(result > UCASE_MAX_STRING_LENGTH) {
            // add a single-code point case mapping
            set.add(result);
        } else {
            // add a string case mapping from full with length result
            str.setTo((UBool)FALSE, full, result);
            set.add(str);
        }
    }
    // result < 0: the code point mapped to itself, no need to add it
    // see ucase.h
}